

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tostring.cc
# Opt level: O2

void re2::AppendCCRange(string *t,Rune lo,Rune hi)

{
  if (lo <= hi) {
    AppendCCChar(t,lo);
    if (lo < hi) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append(t,"-")
      ;
      AppendCCChar(t,hi);
      return;
    }
  }
  return;
}

Assistant:

static void AppendCCRange(std::string* t, Rune lo, Rune hi) {
  if (lo > hi)
    return;
  AppendCCChar(t, lo);
  if (lo < hi) {
    t->append("-");
    AppendCCChar(t, hi);
  }
}